

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

void getSystemBasePath(char *path,uint pathLength,uint *subLength)

{
  char *pcVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  
  if (path != (char *)0x0 || subLength == (uint *)0x0) {
    if (path == (char *)0x0) {
      return;
    }
    pcVar4 = path + ((ulong)pathLength - 1);
    uVar3 = 0;
    do {
      pcVar1 = getSystemBasePath::systemPaths[uVar3];
      pcVar8 = pcVar1 + ((ulong)"\t\v\x0f\x11"[uVar3 >> 1 & 0x7fffffff] - 1);
      pcVar6 = pcVar8;
      pcVar5 = pcVar8;
      pcVar7 = pcVar4;
      if (pcVar1 <= pcVar8 && path <= pcVar4) {
        do {
          pcVar6 = pcVar8;
          if (*pcVar7 == *pcVar5) {
            pcVar6 = pcVar5 + -1;
          }
          pcVar7 = pcVar7 + -1;
        } while ((pcVar1 <= pcVar6) && (pcVar5 = pcVar6, path <= pcVar7));
      }
      if (pcVar6 < pcVar1) {
        uVar2 = (uint)"\x05\v"[uVar3 >> 2 & 0x3fffffff] + ((int)pcVar7 - (int)path) + 1;
        goto LAB_00101cc7;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != 8);
  }
  uVar2 = 0;
LAB_00101cc7:
  *subLength = uVar2;
  return;
}

Assistant:

void getSystemBasePath(const char * path, unsigned int pathLength, unsigned int * subLength)
{
    static const char * systemPaths[] = {
        "/usr/bin/",
        "/usr/lib/",
        "/usr/lib32/",
        "/usr/lib64/",
        "/usr/local/bin/",
        "/usr/local/lib/",
        "/usr/local/lib32/",
        "/usr/local/lib64/",
    };
    static unsigned char systemPathLengths[] = { 9, 11, 15, 17 };
    static unsigned char systemPathPrefixLength[] = { 5, 11 };

    if (!checkStringParameter(path, subLength))
    {
        return;
    }

    for (int i = 0; i < 8; ++i)
    {
        const char * systemPath = systemPaths[i];
        unsigned char systemPathLength = systemPathLengths[i >> 1];

        const char * iter = path + pathLength - 1;
        const char * resetSearchIter = systemPath + systemPathLength - 1;
        const char * searchIter = resetSearchIter;
        while (searchIter >= systemPath && iter >= path)
        {
            searchIter = *iter == *searchIter ? searchIter - 1 : resetSearchIter;
            --iter;
        }

        if (searchIter < systemPath) // sub-systemPath-string found
        {
            *subLength = (unsigned int)(iter - path) + systemPathPrefixLength[i >> 2] + 1;
            return;
        }
    }

    *subLength = 0;
}